

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

void __thiscall
EOPlus::Parser::ParseRuleActionBlock
          (Parser *this,deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *rules,
          deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *actions,
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *custom_handler,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *error_handler)

{
  Expression *__x;
  deque<util::variant,_std::allocator<util::variant>_> *__x_00;
  variant *this_00;
  Parser_Token_Server_Base *pPVar1;
  bool bVar2;
  int iVar3;
  _Alloc_hider _Var4;
  long *plVar5;
  Token t;
  Rule rule;
  Action action;
  undefined1 local_5a0 [24];
  _Alloc_hider local_588;
  size_type local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  bool local_568;
  bool bStack_567;
  bool bStack_566;
  bool bStack_565;
  bool bStack_564;
  undefined3 uStack_563;
  var_type local_560;
  int local_558;
  _Any_data *local_550;
  _Any_data *local_548;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500;
  Rule local_4e0;
  undefined1 local_298 [24];
  _Alloc_hider local_280;
  long local_270 [3];
  var_type local_258;
  int local_250;
  undefined1 local_248 [24];
  _Alloc_hider local_230;
  long local_220 [3];
  var_type local_208;
  int local_200;
  undefined1 local_1f8 [88];
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  deque<util::variant,_std::allocator<util::variant>_> local_180;
  deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> dStack_130;
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  deque<util::variant,_std::allocator<util::variant>_> dStack_c0;
  variant local_70;
  
  util::variant::variant(&local_70);
  local_5a0._0_4_ = Invalid;
  local_5a0._8_4_ = local_70.val_int;
  local_5a0._12_4_ = local_70._4_4_;
  local_5a0._16_4_ = local_70.val_float._0_4_;
  local_5a0._20_4_ = local_70.val_float._4_4_;
  local_588._M_p = (pointer)&local_578;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_588,local_70.val_string._M_dataplus._M_p,
             local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
  local_560 = local_70.type;
  local_568 = local_70.val_bool;
  bStack_567 = local_70.cache_val[0];
  bStack_566 = local_70.cache_val[1];
  bStack_565 = local_70.cache_val[2];
  bStack_564 = local_70.cache_val[3];
  uStack_563 = local_70._53_3_;
  local_558 = 0;
  local_550 = (_Any_data *)custom_handler;
  local_548 = (_Any_data *)error_handler;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.val_string._M_dataplus._M_p != &local_70.val_string.field_2) {
    operator_delete(local_70.val_string._M_dataplus._M_p,
                    local_70.val_string.field_2._M_allocated_capacity + 1);
  }
  this_00 = (variant *)(local_5a0 + 8);
  __x = &local_4e0.action.expr;
  __x_00 = &local_4e0.action.expr.args;
LAB_00140e70:
  do {
    while( true ) {
      do {
        while( true ) {
          bVar2 = GetToken(this,(Token *)local_5a0,0x41);
          if (!bVar2) goto LAB_00141487;
          if (local_5a0._0_4_ != Symbol) break;
          util::variant::GetString_abi_cxx11_((string *)&local_4e0,this_00);
          iVar3 = std::__cxx11::string::compare((char *)&local_4e0);
          if ((iterator *)
              CONCAT44(local_4e0.expr.scopes.
                       super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                       super__Deque_impl_data._M_map._4_4_,
                       local_4e0.expr.scopes.
                       super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                       super__Deque_impl_data._M_map._0_4_) !=
              (iterator *)
              ((long)&local_4e0.expr.scopes.
                      super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                      super__Deque_impl_data + 0x10U)) {
            operator_delete((undefined1 *)
                            CONCAT44(local_4e0.expr.scopes.
                                     super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                     ._M_impl.super__Deque_impl_data._M_map._4_4_,
                                     local_4e0.expr.scopes.
                                     super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                     ._M_impl.super__Deque_impl_data._M_map._0_4_),
                            (ulong)((long)&(local_4e0.expr.scopes.
                                            super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_cur)->type +
                                   1));
          }
          if (iVar3 == 0) goto LAB_001414e9;
          util::variant::GetString_abi_cxx11_((string *)&local_4e0,this_00);
          iVar3 = std::__cxx11::string::compare((char *)&local_4e0);
          if ((iterator *)
              CONCAT44(local_4e0.expr.scopes.
                       super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                       super__Deque_impl_data._M_map._4_4_,
                       local_4e0.expr.scopes.
                       super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                       super__Deque_impl_data._M_map._0_4_) !=
              (iterator *)
              ((long)&local_4e0.expr.scopes.
                      super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                      super__Deque_impl_data + 0x10U)) {
            operator_delete((undefined1 *)
                            CONCAT44(local_4e0.expr.scopes.
                                     super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                     ._M_impl.super__Deque_impl_data._M_map._4_4_,
                                     local_4e0.expr.scopes.
                                     super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                     ._M_impl.super__Deque_impl_data._M_map._0_4_),
                            (ulong)((long)&(local_4e0.expr.scopes.
                                            super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_cur)->type +
                                   1));
          }
          if (iVar3 != 0) {
            pPVar1 = (this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
            local_298._0_4_ = local_5a0._0_4_;
            local_298._8_4_ = local_5a0._8_4_;
            local_298._12_4_ = local_5a0._12_4_;
            local_298._16_4_ = local_5a0._16_4_;
            local_298._20_4_ = local_5a0._20_4_;
            plVar5 = local_270;
            local_280._M_p = (pointer)plVar5;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_280,local_588._M_p,local_588._M_p + local_580);
            local_258 = local_560;
            local_270[2]._0_1_ = local_568;
            local_270[2]._1_1_ = bStack_567;
            local_270[2]._2_1_ = bStack_566;
            local_270[2]._3_1_ = bStack_565;
            local_270[2]._4_1_ = bStack_564;
            local_270[2]._5_3_ = uStack_563;
            local_250 = local_558;
            Parser_Token_Server_Base::PutBack(pPVar1,(Token *)local_298);
            _Var4._M_p = local_280._M_p;
            goto LAB_00141477;
          }
        }
      } while (local_5a0._0_4_ != Identifier);
      util::variant::GetString_abi_cxx11_((string *)&local_4e0,this_00);
      iVar3 = std::__cxx11::string::compare((char *)&local_4e0);
      if ((iterator *)
          CONCAT44(local_4e0.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data._M_map._4_4_,
                   local_4e0.expr.scopes.
                   super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                   super__Deque_impl_data._M_map._0_4_) !=
          (iterator *)
          ((long)&local_4e0.expr.scopes.
                  super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                  super__Deque_impl_data + 0x10U)) {
        operator_delete((undefined1 *)
                        CONCAT44(local_4e0.expr.scopes.
                                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                 _M_impl.super__Deque_impl_data._M_map._4_4_,
                                 local_4e0.expr.scopes.
                                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                                 _M_impl.super__Deque_impl_data._M_map._0_4_),
                        (ulong)((long)&(local_4e0.expr.scopes.
                                        super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1))
        ;
      }
      if (iVar3 != 0) break;
      ParseRule(&local_4e0,this);
      std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::emplace_back<EOPlus::Rule>
                (rules,&local_4e0);
LAB_00141322:
      Rule::~Rule(&local_4e0);
    }
    util::variant::GetString_abi_cxx11_((string *)&local_4e0,this_00);
    iVar3 = std::__cxx11::string::compare((char *)&local_4e0);
    if ((iterator *)
        CONCAT44(local_4e0.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._4_4_,
                 local_4e0.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._0_4_) !=
        (iterator *)
        ((long)&local_4e0.expr.scopes.
                super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                super__Deque_impl_data + 0x10U)) {
      operator_delete((undefined1 *)
                      CONCAT44(local_4e0.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._4_4_,
                               local_4e0.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._0_4_),
                      (ulong)((long)&(local_4e0.expr.scopes.
                                      super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1));
    }
    if (iVar3 == 0) {
      ParseAction((Action *)&local_4e0,this);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::emplace_back<EOPlus::Action>
                (actions,(Action *)&local_4e0);
LAB_001410a1:
      std::deque<util::variant,_std::allocator<util::variant>_>::~deque
                (&local_4e0.action.cond_expr.args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.action.cond_expr.function._M_dataplus._M_p !=
          &local_4e0.action.cond_expr.function.field_2) {
        operator_delete(local_4e0.action.cond_expr.function._M_dataplus._M_p,
                        local_4e0.action.cond_expr.function.field_2._M_allocated_capacity + 1);
      }
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                (&local_4e0.action.cond_expr.scopes);
      std::deque<util::variant,_std::allocator<util::variant>_>::~deque
                ((deque<util::variant,_std::allocator<util::variant>_> *)
                 ((long)&local_4e0.expr.args.
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data + 8));
      if ((undefined1 *)local_4e0.expr.function._M_string_length !=
          (undefined1 *)((long)&local_4e0.expr.function.field_2 + 8)) {
        operator_delete((void *)local_4e0.expr.function._M_string_length,
                        local_4e0.expr.function.field_2._8_8_ + 1);
      }
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)
                 ((long)&local_4e0.expr.scopes.
                         super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                         super__Deque_impl_data + 8));
      goto LAB_00140e70;
    }
    util::variant::GetString_abi_cxx11_((string *)&local_4e0,this_00);
    iVar3 = std::__cxx11::string::compare((char *)&local_4e0);
    if ((iterator *)
        CONCAT44(local_4e0.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._4_4_,
                 local_4e0.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._0_4_) !=
        (iterator *)
        ((long)&local_4e0.expr.scopes.
                super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                super__Deque_impl_data + 0x10U)) {
      operator_delete((undefined1 *)
                      CONCAT44(local_4e0.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._4_4_,
                               local_4e0.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._0_4_),
                      (ulong)((long)&(local_4e0.expr.scopes.
                                      super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1));
    }
    if (iVar3 == 0) {
      ParseRule(&local_4e0,this);
      Action::Action((Action *)local_1f8);
      local_1f8._0_4_ = If;
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)(local_1f8 + 8),
                 (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)&local_4e0);
      std::__cxx11::string::_M_assign((string *)&local_1a0);
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=
                (&local_180,&local_4e0.expr.args);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=(&dStack_130,&__x->scopes)
      ;
      std::__cxx11::string::_M_assign((string *)&local_e0);
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=(&dStack_c0,__x_00);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                (actions,(value_type *)local_1f8);
LAB_001412b0:
      std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&dStack_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
      }
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(&dStack_130);
      std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_p != &local_190) {
        operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
      }
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)(local_1f8 + 8));
      goto LAB_00141322;
    }
    util::variant::GetString_abi_cxx11_((string *)&local_4e0,this_00);
    iVar3 = std::__cxx11::string::compare((char *)&local_4e0);
    if (iVar3 == 0) {
      bVar2 = true;
    }
    else {
      util::variant::GetString_abi_cxx11_(&local_500,this_00);
      iVar3 = std::__cxx11::string::compare((char *)&local_500);
      bVar2 = iVar3 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
      }
    }
    if ((iterator *)
        CONCAT44(local_4e0.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._4_4_,
                 local_4e0.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._0_4_) !=
        (iterator *)
        ((long)&local_4e0.expr.scopes.
                super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                super__Deque_impl_data + 0x10U)) {
      operator_delete((undefined1 *)
                      CONCAT44(local_4e0.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._4_4_,
                               local_4e0.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._0_4_),
                      (ulong)((long)&(local_4e0.expr.scopes.
                                      super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1));
    }
    if (bVar2) {
      ParseRule(&local_4e0,this);
      Action::Action((Action *)local_1f8);
      local_1f8._0_4_ = ElseIf;
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)(local_1f8 + 8),
                 (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)&local_4e0);
      std::__cxx11::string::_M_assign((string *)&local_1a0);
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=
                (&local_180,&local_4e0.expr.args);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::operator=(&dStack_130,&__x->scopes)
      ;
      std::__cxx11::string::_M_assign((string *)&local_e0);
      std::deque<util::variant,_std::allocator<util::variant>_>::operator=(&dStack_c0,__x_00);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                (actions,(value_type *)local_1f8);
      goto LAB_001412b0;
    }
    util::variant::GetString_abi_cxx11_((string *)&local_4e0,this_00);
    iVar3 = std::__cxx11::string::compare((char *)&local_4e0);
    if ((iterator *)
        CONCAT44(local_4e0.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._4_4_,
                 local_4e0.expr.scopes.
                 super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                 super__Deque_impl_data._M_map._0_4_) !=
        (iterator *)
        ((long)&local_4e0.expr.scopes.
                super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                super__Deque_impl_data + 0x10U)) {
      operator_delete((undefined1 *)
                      CONCAT44(local_4e0.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._4_4_,
                               local_4e0.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_map._0_4_),
                      (ulong)((long)&(local_4e0.expr.scopes.
                                      super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->type + 1));
    }
    if (iVar3 == 0) {
      ParseAction((Action *)&local_4e0,this);
      local_4e0.expr.scopes.super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl
      .super__Deque_impl_data._M_map._0_4_ = 2;
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                (actions,(value_type *)&local_4e0);
      goto LAB_001410a1;
    }
    util::variant::GetString_abi_cxx11_(&local_540,this_00);
    if (*(long *)(local_550 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    bVar2 = (**(code **)(local_550->_M_pod_data + 0x18))(local_550,&local_540);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      pPVar1 = (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      local_248._0_4_ = local_5a0._0_4_;
      local_248._8_4_ = local_5a0._8_4_;
      local_248._12_4_ = local_5a0._12_4_;
      local_248._16_4_ = local_5a0._16_4_;
      local_248._20_4_ = local_5a0._20_4_;
      plVar5 = local_220;
      local_230._M_p = (pointer)plVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_588._M_p,local_588._M_p + local_580);
      local_208 = local_560;
      local_220[2]._0_1_ = local_568;
      local_220[2]._1_1_ = bStack_567;
      local_220[2]._2_1_ = bStack_566;
      local_220[2]._3_1_ = bStack_565;
      local_220[2]._4_1_ = bStack_564;
      local_220[2]._5_3_ = uStack_563;
      local_200 = local_558;
      Parser_Token_Server_Base::PutBack(pPVar1,(Token *)local_248);
      _Var4._M_p = local_230._M_p;
LAB_00141477:
      if ((long *)_Var4._M_p != plVar5) {
        operator_delete(_Var4._M_p,*plVar5 + 1);
      }
LAB_00141487:
      local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_520,"rule/action/if/elseif/else","");
      if (*(long *)(local_548 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_548->_M_pod_data + 0x18))(local_548,&local_520);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
      }
LAB_001414e9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_p != &local_578) {
        operator_delete(local_588._M_p,local_578._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void Parser::ParseRuleActionBlock(std::deque<Rule>& rules, std::deque<Action>& actions, std::function<bool(std::string)> custom_handler, std::function<void(std::string)> error_handler)
	{
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::Symbol))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "rule")
				{
					rules.push_back(this->ParseRule());
				}
				else if (std::string(t.data) == "action")
				{
					actions.push_back(this->ParseAction());
				}
				else if (std::string(t.data) == "if")
				{
					Rule rule = this->ParseRule();
					Action action;
					action.cond = Action::If;
					action.cond_expr = rule.expr;
					action.expr = rule.action.expr;
					actions.push_back(action);
				}
				else if (std::string(t.data) == "elseif" || std::string(t.data) == "elif")
				{
					Rule rule = this->ParseRule();
					Action action;
					action.cond = Action::ElseIf;
					action.cond_expr = rule.expr;
					action.expr = rule.action.expr;
					actions.push_back(action);
				}
				else if (std::string(t.data) == "else")
				{
					Action action = this->ParseAction();
					action.cond = Action::Else;
					actions.push_back(action);
				}
				else
				{
					if (!custom_handler(std::string(t.data)))
					{
						this->tok->PutBack(t);
						break;
					}
				}
			}
			else if (t.type == Token::Symbol)
			{
				if (std::string(t.data) == "}")
				{
					return;
				}
				else if (std::string(t.data) == ";")
				{
					continue;
				}
				else
				{
					this->tok->PutBack(t);
					break;
				}
			}
		}

		// PARSER_ERROR_GOT("Expected rule-action-block entry (rule/action) or closing brace '}'.")
		error_handler("rule/action/if/elseif/else");
	}